

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

bool cmCTestRunTest::StartTest
               (unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *runner,
               size_t completed,size_t total)

{
  cmCTestRunTest *this;
  bool bVar1;
  cmProcess *this_00;
  pointer __p;
  _Head_base<0UL,_cmCTestRunTest_*,_false> local_38;
  
  this = (runner->_M_t).super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>.
         _M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
         super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl;
  this_00 = (cmProcess *)operator_new(0x128);
  (runner->_M_t).super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
  super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
  super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl = (cmCTestRunTest *)0x0;
  local_38._M_head_impl = this;
  cmProcess::cmProcess
            (this_00,(unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&local_38);
  std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr
            ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&local_38);
  local_38._M_head_impl = (cmCTestRunTest *)0x0;
  std::__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>::reset
            ((__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_> *)&this->TestProcess,
             this_00);
  std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
            ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)&local_38);
  bVar1 = StartTest(this,completed,total);
  if (!bVar1) {
    FinalizeTest(this,false);
  }
  return bVar1;
}

Assistant:

bool cmCTestRunTest::StartTest(std::unique_ptr<cmCTestRunTest> runner,
                               size_t completed, size_t total)
{
  auto* testRun = runner.get();

  testRun->TestProcess = cm::make_unique<cmProcess>(std::move(runner));

  if (!testRun->StartTest(completed, total)) {
    testRun->FinalizeTest(false);
    return false;
  }

  return true;
}